

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O2

optional<SignetTxs> *
SignetTxs::Create(optional<SignetTxs> *__return_storage_ptr__,CBlock *block,CScript *challenge)

{
  long lVar1;
  pointer psVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<uint256,_std::allocator<uint256>_> hashes;
  bool bVar7;
  int iVar8;
  const_reference pvVar9;
  reference pvVar10;
  iterator iVar11;
  size_t s;
  ulong uVar12;
  long lVar13;
  CScript *this;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  undefined4 uStack_268;
  uint local_264;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signet_solution;
  CMutableTransaction tx_to_spend;
  VectorWriter writer;
  const_iterator pc;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  CScript replacement;
  uint256 signet_merkle;
  CMutableTransaction modified_cb;
  CMutableTransaction tx_spending;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx_to_spend);
  tx_to_spend.version = 0;
  tx_to_spend.nLockTime = 0;
  replacement.super_CScriptBase._union._16_8_ = 0;
  replacement.super_CScriptBase._24_8_ = 0;
  replacement.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  replacement.super_CScriptBase._union._8_8_ = 0;
  CScript::CScript((CScript *)&tx_spending,OP_0);
  modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_to_spend,(COutPoint *)&replacement,
             (CScript *)&tx_spending,(int *)&modified_cb);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&tx_spending);
  replacement.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)replacement.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffff00000000);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_to_spend.vout,(int *)&replacement,
             challenge);
  CMutableTransaction::CMutableTransaction(&tx_spending);
  tx_spending.version = 0;
  tx_spending.nLockTime = 0;
  replacement.super_CScriptBase._union._16_8_ = 0;
  replacement.super_CScriptBase._24_8_ = 0;
  replacement.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  replacement.super_CScriptBase._union._8_8_ = 0;
  modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  modified_cb.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (ulong)(uint)signet_merkle.super_base_blob<256U>.m_data._M_elems._4_4_ << 0x20;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_spending,(COutPoint *)&replacement,
             (CScript *)&modified_cb,(int *)&signet_merkle);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&modified_cb);
  modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)modified_cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  CScript::CScript(&replacement,OP_RETURN);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_spending.vout,(int *)&modified_cb,
             &replacement);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&replacement.super_CScriptBase);
  if ((block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
    super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>.
    _M_engaged = false;
    goto LAB_008880c4;
  }
  pvVar9 = std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::at(&block->vtx,0);
  CMutableTransaction::CMutableTransaction
            (&modified_cb,
             (pvVar9->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  iVar8 = GetWitnessCommitmentIndex(block);
  if (iVar8 == -1) {
    (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
    super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>.
    _M_engaged = false;
  }
  else {
    pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&modified_cb.vout,(long)iVar8);
    this = &pvVar10->scriptPubKey;
    signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = SIGNET_HEADER;
    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x4;
    replacement.super_CScriptBase._union._16_8_ = 0;
    replacement.super_CScriptBase._24_8_ = 0;
    replacement.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    replacement.super_CScriptBase._union._8_8_ = 0;
    pc.ptr = (uchar *)this;
    if (0x1c < (pvVar10->scriptPubKey).super_CScriptBase._size) {
      pc.ptr = (uchar *)(pvVar10->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect;
    }
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    signet_merkle.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_264 = 0;
    while( true ) {
      bVar7 = CScript::GetOp(this,&pc,&opcode,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signet_merkle
                            );
      if (!bVar7) break;
      if (signet_merkle.super_base_blob<256U>.m_data._M_elems._8_8_ ==
          signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_) {
        CScript::operator<<(&replacement,opcode);
      }
      else {
        if (((local_264 & 1) == 0) &&
           (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish <
            (pointer)(signet_merkle.super_base_blob<256U>.m_data._M_elems._8_8_ -
                     signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_))) {
          writer.vchData =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_;
          writer.nPos = (size_t)block_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
          bVar7 = std::ranges::__equal_fn::
                  operator()<Span<unsigned_char>,_const_Span<const_unsigned_char>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                            ((__equal_fn *)&std::ranges::equal,&writer,&block_data);
          if (bVar7) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&signet_solution,
                       (const_iterator)
                       signet_solution.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(block_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                         signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )signet_merkle.super_base_blob<256U>.m_data._M_elems._8_8_);
            iVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &signet_merkle,
                                (const_iterator)
                                (block_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish +
                                signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_),
                                (const_iterator)
                                signet_merkle.super_base_blob<256U>.m_data._M_elems._8_8_);
            local_264 = (uint)CONCAT71((int7)((ulong)iVar11._M_current >> 8),1);
          }
        }
        b._M_extent._M_extent_value =
             signet_merkle.super_base_blob<256U>.m_data._M_elems._8_8_ -
             signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_;
        b._M_ptr = (pointer)signet_merkle.super_base_blob<256U>.m_data._M_elems._0_8_;
        CScript::operator<<(&replacement,b);
      }
    }
    if ((local_264 & 1) == 0) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signet_merkle);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&replacement.super_CScriptBase);
LAB_00887edd:
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::resize
                ((vector<uint256,_std::allocator<uint256>_> *)&block_data,
                 (long)(block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      CMutableTransaction::GetHash((Txid *)&replacement,&modified_cb);
      *(undefined8 *)
       (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 0x10) = replacement.super_CScriptBase._union._16_8_;
      *(undefined8 *)
       (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 0x18) = replacement.super_CScriptBase._24_8_;
      *(char **)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start =
           replacement.super_CScriptBase._union.indirect_contents.indirect;
      *(undefined8 *)
       (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 8) = replacement.super_CScriptBase._union._8_8_;
      lVar13 = 0x10;
      for (uVar12 = 1;
          psVar2 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(block->vtx).
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
          uVar12 = uVar12 + 1) {
        lVar3 = *(long *)((long)&(psVar2->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr + lVar13);
        uVar4 = *(undefined8 *)(lVar3 + 0x39);
        uVar5 = *(undefined8 *)(lVar3 + 0x41);
        uVar6 = *(undefined8 *)(lVar3 + 0x51);
        *(undefined8 *)
         (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + lVar13 * 2 + 0x10) = *(undefined8 *)(lVar3 + 0x49);
        *(undefined8 *)
         (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + lVar13 * 2 + 0x10 + 8) = uVar6;
        *(undefined8 *)
         (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + lVar13 * 2) = uVar4;
        *(undefined8 *)
         (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + lVar13 * 2 + 8) = uVar5;
        lVar13 = lVar13 + 0x10;
      }
      replacement.super_CScriptBase._union.indirect_contents.indirect =
           (char *)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      replacement.super_CScriptBase._union._8_8_ =
           block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      replacement.super_CScriptBase._union._16_8_ =
           block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = local_264;
      hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = uStack_268;
      hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)__return_storage_ptr__;
      hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)signet_solution.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      ComputeMerkleRoot(&signet_merkle,hashes,(bool *)&replacement);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&replacement);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&block_data);
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VectorWriter::VectorWriter(&writer,&block_data,0);
      VectorWriter::operator<<(&writer,(int *)block);
      base_blob<256U>::Serialize<VectorWriter>
                (&(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>,&writer);
      base_blob<256U>::Serialize<VectorWriter>(&signet_merkle.super_base_blob<256U>,&writer);
      VectorWriter::operator<<(&writer,&(block->super_CBlockHeader).nTime);
      b_00._M_extent._M_extent_value =
           (long)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      b_00._M_ptr = block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      CScript::operator<<(&(tx_to_spend.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                            _M_impl.super__Vector_impl_data._M_start)->scriptSig,b_00);
      CMutableTransaction::GetHash((Txid *)&replacement,&tx_to_spend);
      *(undefined8 *)
       (((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = replacement.super_CScriptBase._union._16_8_;
      *(undefined8 *)
       (((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = replacement.super_CScriptBase._24_8_;
      *(char **)((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
                m_data._M_elems = replacement.super_CScriptBase._union.indirect_contents.indirect;
      *(undefined8 *)
       (((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = replacement.super_CScriptBase._union._8_8_;
      ((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).n = 0;
      SignetTxs<CMutableTransaction,CMutableTransaction>
                ((SignetTxs *)&replacement,&tx_to_spend,&tx_spending);
      std::_Optional_payload_base<SignetTxs>::_Optional_payload_base<SignetTxs>
                ((_Optional_payload_base<SignetTxs> *)__return_storage_ptr__,&replacement);
      ~SignetTxs((SignetTxs *)&replacement);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&this->super_CScriptBase,&replacement.super_CScriptBase);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signet_merkle);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&replacement.super_CScriptBase);
      replacement.super_CScriptBase._union._8_8_ =
           (long)signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      replacement.super_CScriptBase._union.indirect_contents.indirect =
           (char *)signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      Unserialize<SpanReader,28u,unsigned_char>
                ((SpanReader *)&replacement,
                 &((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase);
      Unserialize<SpanReader,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((SpanReader *)&replacement,
                 &((tx_spending.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptWitness).stack);
      if (replacement.super_CScriptBase._union._8_8_ == 0) goto LAB_00887edd;
      (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
      super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>
      ._M_engaged = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signet_solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  CMutableTransaction::~CMutableTransaction(&modified_cb);
LAB_008880c4:
  CMutableTransaction::~CMutableTransaction(&tx_spending);
  CMutableTransaction::~CMutableTransaction(&tx_to_spend);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<SignetTxs> SignetTxs::Create(const CBlock& block, const CScript& challenge)
{
    CMutableTransaction tx_to_spend;
    tx_to_spend.version = 0;
    tx_to_spend.nLockTime = 0;
    tx_to_spend.vin.emplace_back(COutPoint(), CScript(OP_0), 0);
    tx_to_spend.vout.emplace_back(0, challenge);

    CMutableTransaction tx_spending;
    tx_spending.version = 0;
    tx_spending.nLockTime = 0;
    tx_spending.vin.emplace_back(COutPoint(), CScript(), 0);
    tx_spending.vout.emplace_back(0, CScript(OP_RETURN));

    // can't fill any other fields before extracting signet
    // responses from block coinbase tx

    // find and delete signet signature
    if (block.vtx.empty()) return std::nullopt; // no coinbase tx in block; invalid
    CMutableTransaction modified_cb(*block.vtx.at(0));

    const int cidx = GetWitnessCommitmentIndex(block);
    if (cidx == NO_WITNESS_COMMITMENT) {
        return std::nullopt; // require a witness commitment
    }

    CScript& witness_commitment = modified_cb.vout.at(cidx).scriptPubKey;

    std::vector<uint8_t> signet_solution;
    if (!FetchAndClearCommitmentSection(SIGNET_HEADER, witness_commitment, signet_solution)) {
        // no signet solution -- allow this to support OP_TRUE as trivial block challenge
    } else {
        try {
            SpanReader v{signet_solution};
            v >> tx_spending.vin[0].scriptSig;
            v >> tx_spending.vin[0].scriptWitness.stack;
            if (!v.empty()) return std::nullopt; // extraneous data encountered
        } catch (const std::exception&) {
            return std::nullopt; // parsing error
        }
    }
    uint256 signet_merkle = ComputeModifiedMerkleRoot(modified_cb, block);

    std::vector<uint8_t> block_data;
    VectorWriter writer{block_data, 0};
    writer << block.nVersion;
    writer << block.hashPrevBlock;
    writer << signet_merkle;
    writer << block.nTime;
    tx_to_spend.vin[0].scriptSig << block_data;
    tx_spending.vin[0].prevout = COutPoint(tx_to_spend.GetHash(), 0);

    return SignetTxs{tx_to_spend, tx_spending};
}